

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O0

void __thiscall
capnp::compiler::Lexer::Lexer(Lexer *this,Orphanage orphanageParam,ErrorReporter *errorReporter)

{
  ExactlyConst_<char,__(_> *pEVar1;
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,____>_>,_kj::parse::_::ArrayToString>
  *subParsers_1;
  Transform_<kj::parse::Sequence_<kj::parse::Many_<const_kj::parse::CharGroup__&,_true>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_kj::parse::Optional_<kj::parse::CharGroup_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>,_kj::parse::_::ParseFloat>
  *functor;
  Sequence_<_85621a7a_> *other;
  OneOf_<_100ac927_> *pOVar2;
  parse *ppVar3;
  Sequence_<_4053c1f6_> *other_00;
  Parser<kj::Array<Orphan<Token>_>_> *this_00;
  ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>
  *subParsers_1_00;
  Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>
  *subParsers_1_01;
  ExactlyConst_<char,___xfe_> *subParsers_1_02;
  Parser<kj::Array<Orphan<Statement>_>_> *subParsers_1_03;
  Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
  *subParser;
  Many_<kj::parse::CharGroup_,_true> *subParser_00;
  ExactlyConst_<char,___xff_> *subParsers;
  ExactlyConst_<char,___xfe_> *subParsers_00;
  ExactlyConst_<char,___x00_> *subParsers_01;
  Sequence_<_ffff1d11_> *subParser_01;
  Sequence_<kj::parse::ExactlyConst_<char,___x00_>_> *in_R8;
  TransformWithLocation_<const_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,____>_>,_kj::parse::_::ArrayToString>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:184:11)>
  TVar4;
  TransformWithLocation_<const_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Many_<const_kj::parse::CharGroup__&,_true>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_kj::parse::Optional_<kj::parse::CharGroup_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>,_kj::parse::_::ParseFloat>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:216:11)>
  TVar5;
  TransformWithLocation_<const_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Many_<const_kj::parse::CharGroup__&,_true>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_kj::parse::Optional_<kj::parse::CharGroup_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>,_kj::parse::_::ParseFloat>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:216:11)>
  *parsers_5;
  Sequence_<_ffff1d11_> local_720;
  undefined1 local_708 [71];
  Sequence_<_f1e3f6d_> local_6c1;
  TransformWithLocation_<_bb8cc45_> local_6a8;
  parse *local_688;
  TransformWithLocation_<_bb8cc45_> *statement;
  undefined1 local_673 [3];
  Sequence_<_2f3d041a_> local_670;
  Transform_<_e61e25b1_> local_640;
  Lexer *local_608;
  parse local_5f9;
  Sequence_<kj::parse::ExactlyConst_<char,____>,_const_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>_&>
  local_5f8;
  Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_const_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:260:11)>
  local_5e0;
  OneOf_<_100ac927_> local_5c0;
  OneOf_<_100ac927_> *local_560;
  OneOf_<_100ac927_> *statementEnd;
  Parser<kj::Array<Orphan<Statement>_>_> *statementSequence;
  Many_<_35c7ed20_> local_538;
  Sequence_<_85621a7a_> local_520;
  undefined1 local_4f1;
  OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___x00_>_>_>
  local_4f0 [2];
  undefined4 local_4d8;
  parse local_4d1 [2];
  undefined1 local_4cf [8];
  parse local_4c7 [2];
  undefined1 local_4c5 [4];
  parse local_4c1 [9];
  TransformWithLocation_<kj::parse::OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___x00_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:248:11)>
  local_4b8;
  TransformOrReject_<kj::parse::TransformWithLocation_<kj::parse::OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___x00_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:248:11)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:252:15)>
  local_4a0;
  Lexer *local_480;
  ExactlyConst_<char,___xfe_> local_473 [2];
  parse local_471;
  Sequence_<kj::parse::ExactlyConst_<char,__[_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>_&,_kj::parse::ExactlyConst_<char,__]_>_>
  local_470;
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__[_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>_&,_kj::parse::ExactlyConst_<char,__]_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:238:11)>
  local_458;
  Lexer *local_438;
  undefined1 local_42b [3];
  Sequence_<kj::parse::ExactlyConst_<char,__(_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>_&,_kj::parse::ExactlyConst_<char,__)_>_>
  local_428;
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__(_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>_&,_kj::parse::ExactlyConst_<char,__)_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:230:11)>
  local_410;
  Transform_<kj::parse::Many_<kj::parse::CharGroup_,_true>,_kj::parse::_::ArrayToString> local_3f0;
  Many_<kj::parse::CharGroup_,_true> local_3c8;
  Transform_<kj::parse::Many_<kj::parse::CharGroup_,_true>,_kj::parse::_::ArrayToString> local_3a8;
  TransformWithLocation_<kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_true>,_kj::parse::_::ArrayToString>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:223:11)>
  local_380;
  Type local_350;
  TransformWithLocation_<const_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Many_<const_kj::parse::CharGroup__&,_true>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_kj::parse::Optional_<kj::parse::CharGroup_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>,_kj::parse::_::ParseFloat>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:216:11)>
  local_348;
  Type local_338;
  TransformWithLocation_<const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:210:11)>
  local_330;
  Type local_320;
  TransformWithLocation_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>,_true>,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ExactlyConst_<char,____>_>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:204:11)>
  local_318;
  Lexer *local_308;
  CharGroup_ local_300;
  CharGroup_ local_2e0;
  Many_<kj::parse::CharGroup_,_false> local_2c0;
  parse local_299;
  Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::CharGroup_,_false>_>
  local_298;
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::CharGroup_,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:191:11)>
  local_268;
  Type local_230;
  TransformWithLocation_<const_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,____>_>,_kj::parse::_::ArrayToString>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:184:11)>
  local_228;
  Type local_218;
  TransformWithLocation_<const_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:178:11)>
  local_210;
  OneOf_<_f5f02913_> local_200;
  OneOf_<_f5f02913_> *local_e0;
  OneOf_<_f5f02913_> *token;
  Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
  local_d0;
  Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>
  local_b8;
  Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>
  local_a0;
  Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>
  local_78;
  ExactlyConst_<char,__(_> *local_48;
  Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>
  *commaDelimitedList;
  Parser<kj::Array<Orphan<Token>_>_> *tokenSequence;
  ErrorReporter *local_28;
  ErrorReporter *errorReporter_local;
  Lexer *this_local;
  Orphanage orphanageParam_local;
  
  orphanageParam_local.arena = (BuilderArena *)orphanageParam.capTable;
  this_local = (Lexer *)orphanageParam.arena;
  (this->orphanage).arena = (BuilderArena *)this_local;
  (this->orphanage).capTable = (CapTableBuilder *)orphanageParam_local.arena;
  local_28 = errorReporter;
  errorReporter_local = (ErrorReporter *)this;
  kj::Arena::Arena(&this->arena,0x400);
  Parsers::Parsers(&this->parsers);
  this_00 = &(this->parsers).tokenSequence;
  subParsers_1_00 = this_00;
  commaDelimitedList =
       (Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>
        *)this_00;
  kj::parse::exactChar<(char)44>();
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>
            (&local_d0,(parse *)((long)&token + 7),(ExactlyConst_<char,__,_> *)commaDelimitedList,
             subParsers_1_00);
  kj::parse::
  many<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>>
            (&local_b8,(parse *)&local_d0,subParser);
  kj::parse::
  sequence<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>
            (&local_a0,(parse *)this_00,
             (ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>
              *)&local_b8,
             (Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>
              *)subParsers_1_00);
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>
            (&local_78,(parse *)&local_a0,
             (Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>
              *)((long)&token + 5),(Type *)subParsers_1_00);
  local_48 = (ExactlyConst_<char,__(_> *)
             kj::Arena::
             copy<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>>
                       (&this->arena,&local_78);
  local_218.this = this;
  local_210 = kj::parse::
              transformWithLocation<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::IdentifierToString>const&,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__1>
                        ((Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::IdentifierToString>
                          *)kj::parse::identifier,&local_218);
  local_230.this = this;
  TVar4 = kj::parse::
          transformWithLocation<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)34>,kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)92>,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,kj::parse::_::InterpretEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)120>,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexEscape>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_const&,kj::parse::Optional_<kj::parse::CharGroup_const&>,kj::parse::Optional_<kj::parse::CharGroup_const&>>,kj::parse::_::ParseOctEscape>>>const&>,false>,kj::parse::ExactlyConst_<char,(char)34>>,kj::parse::_::ArrayToString>const&,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__2>
                    ((Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::OneOf_<kj::parse::CharGroup_,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_____>,_kj::parse::OneOf_<kj::parse::Transform_<kj::parse::CharGroup_,_kj::parse::_::InterpretEscape>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__x_>,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexEscape>,_kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::CharGroup__&,_kj::parse::Optional_<const_kj::parse::CharGroup__&>,_kj::parse::Optional_<const_kj::parse::CharGroup__&>_>,_kj::parse::_::ParseOctEscape>_>_>_&>,_false>,_kj::parse::ExactlyConst_<char,____>_>,_kj::parse::_::ArrayToString>
                      *)kj::parse::doubleQuotedString,&local_230);
  local_228.transform = TVar4.transform.this;
  subParsers_1 = TVar4.subParser;
  local_228.subParser = subParsers_1;
  kj::parse::exactChar<(char)96>();
  kj::parse::anyOfChars(&local_300,"\r\n");
  kj::parse::CharGroup_::invert(&local_2e0,&local_300);
  kj::parse::many<kj::parse::CharGroup_>(&local_2c0,&local_2e0);
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)96>,kj::parse::Many_<kj::parse::CharGroup_,false>>
            (&local_298,&local_299,(ExactlyConst_<char,____> *)&local_2c0,
             (Many_<kj::parse::CharGroup_,_false> *)subParsers_1);
  local_308 = this;
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)96>,kj::parse::Many_<kj::parse::CharGroup_,false>>,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__3>
            (&local_268,(parse *)&local_298,
             (Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::CharGroup_,_false>_>
              *)&local_308,(Type *)subParsers_1);
  local_320.this = this;
  local_318 = kj::parse::
              transformWithLocation<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::ExactlyConst_<char,(char)34>,kj::parse::Many_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::CharGroup_const&,kj::parse::CharGroup_const&>,kj::parse::_::ParseHexByte>,true>,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ExactlyConst_<char,(char)34>>const&,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__4>
                        ((Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<kj::parse::Transform_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::CharGroup__&,_const_kj::parse::CharGroup__&>,_kj::parse::_::ParseHexByte>,_true>,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ExactlyConst_<char,____>_>
                          *)kj::parse::doubleQuotedHexBinary,&local_320);
  local_338.this = this;
  local_330 = kj::parse::
              transformWithLocation<kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::ExactlyConst_<char,(char)120>,kj::parse::Many_<kj::parse::CharGroup_const&,true>>,kj::parse::_::ParseInteger<16u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)48>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<8u>>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,kj::parse::Many_<kj::parse::CharGroup_const&,false>>,kj::parse::_::ParseInteger<10u>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>const&,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__5>
                        ((Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
                          *)kj::parse::integer,&local_338);
  local_350.this = this;
  TVar5 = kj::parse::
          transformWithLocation<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Many_<kj::parse::CharGroup_const&,true>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)46>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,kj::parse::Optional_<kj::parse::CharGroup_>,kj::parse::Many_<kj::parse::CharGroup_const&,false>>>,kj::parse::NotLookingAt_<kj::parse::CharGroup_>>,kj::parse::_::ParseFloat>const&,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__6>
                    ((Transform_<kj::parse::Sequence_<kj::parse::Many_<const_kj::parse::CharGroup__&,_true>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_kj::parse::Optional_<kj::parse::CharGroup_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>,_kj::parse::_::ParseFloat>
                      *)kj::parse::number,&local_350);
  local_348.transform = TVar5.transform.this;
  functor = TVar5.subParser;
  local_348.subParser = functor;
  kj::parse::anyOfChars((CharGroup_ *)(local_3f0.subParser.subParser.bits + 1),"!$%&*+-./:<=>?@^|~")
  ;
  kj::parse::oneOrMore<kj::parse::CharGroup_>
            (&local_3c8,(CharGroup_ *)(local_3f0.subParser.subParser.bits + 1));
  kj::parse::charsToString<kj::parse::Many_<kj::parse::CharGroup_,true>>
            (&local_3a8,(parse *)&local_3c8,subParser_00);
  local_3f0.subParser.subParser.bits[0] = (Bits64)this;
  kj::parse::
  transformWithLocation<kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,true>,kj::parse::_::ArrayToString>,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__7>
            (&local_380,(parse *)&local_3a8,&local_3f0,(Type *)functor);
  kj::parse::exactChar<(char)40>();
  pEVar1 = local_48;
  kj::parse::exactChar<(char)41>();
  subParsers_1_01 =
       (Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>
        *)local_42b;
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)40>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>&,kj::parse::ExactlyConst_<char,(char)41>>
            (&local_428,(parse *)(local_42b + 2),pEVar1,subParsers_1_01,
             (ExactlyConst_<char,__)_> *)in_R8);
  local_438 = this;
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)40>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>,capnp::compiler::Lexer::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>&,kj::parse::ExactlyConst_<char,(char)41>>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__8>
            (&local_410,(parse *)&local_428,
             (Sequence_<kj::parse::ExactlyConst_<char,__(_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>_&,_kj::parse::ExactlyConst_<char,__)_>_>
              *)&local_438,(Type *)subParsers_1_01);
  kj::parse::exactChar<(char)91>();
  pEVar1 = local_48;
  kj::parse::exactChar<(char)93>();
  subParsers_1_02 = local_473;
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>&,kj::parse::ExactlyConst_<char,(char)93>>
            (&local_470,&local_471,(ExactlyConst_<char,__[_> *)pEVar1,
             (Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>
              *)subParsers_1_02,(ExactlyConst_<char,__]_> *)in_R8);
  local_480 = this;
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)91>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)44>,kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&>,false>>,capnp::compiler::Lexer::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__0>&,kj::parse::ExactlyConst_<char,(char)93>>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__9>
            (&local_458,(parse *)&local_470,
             (Sequence_<kj::parse::ExactlyConst_<char,__[_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&,_kj::parse::Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:155:7)>_&,_kj::parse::ExactlyConst_<char,__]_>_>
              *)&local_480,(Type *)subParsers_1_02);
  kj::parse::exactChar<(char)_1>();
  kj::parse::exactChar<(char)_2>();
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)_1>,kj::parse::ExactlyConst_<char,(char)_2>>
            ((Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>
              *)local_4c5,local_4c7,subParsers,subParsers_1_02);
  kj::parse::exactChar<(char)_2>();
  kj::parse::exactChar<(char)_1>();
  ppVar3 = local_4d1;
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)_2>,kj::parse::ExactlyConst_<char,(char)_1>>
            ((Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>
              *)local_4cf,ppVar3,subParsers_00,(ExactlyConst_<char,___xff_> *)subParsers_1_02);
  kj::parse::exactChar<(char)0>();
  kj::parse::sequence<kj::parse::ExactlyConst_<char,(char)0>>
            ((Sequence_<kj::parse::ExactlyConst_<char,___x00_>_> *)&local_4d8,ppVar3,subParsers_01);
  kj::parse::
  oneOf<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_1>,kj::parse::ExactlyConst_<char,(char)_2>>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_2>,kj::parse::ExactlyConst_<char,(char)_1>>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)0>>>
            ((OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___x00_>_>_>
              *)(local_4c5 + 1),(parse *)(local_4cf + 1),
             (Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>
              *)((long)&local_4d8 + 1),
             (Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>
              *)subParsers_1_02,in_R8);
  local_4f0[0]._0_8_ = local_28;
  kj::parse::
  transformWithLocation<kj::parse::OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_1>,kj::parse::ExactlyConst_<char,(char)_2>>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_2>,kj::parse::ExactlyConst_<char,(char)_1>>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)0>>>,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__10>
            (&local_4b8,local_4c1,local_4f0,(Type *)subParsers_1_02);
  kj::parse::
  transformOrReject<kj::parse::TransformWithLocation_<kj::parse::OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_1>,kj::parse::ExactlyConst_<char,(char)_2>>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_2>,kj::parse::ExactlyConst_<char,(char)_1>>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)0>>>,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__10>,capnp::compiler::Lexer::TransformWithLocation_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__11>
            (&local_4a0,(parse *)&local_4b8,
             (TransformWithLocation_<kj::parse::OneOf_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xff_>,_kj::parse::ExactlyConst_<char,___xfe_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xfe_>,_kj::parse::ExactlyConst_<char,___xff_>_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___x00_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:248:11)>
              *)&local_4f1,(Type *)subParsers_1_02);
  parsers_5 = &local_348;
  kj::parse::oneOf<_f5f02913_>
            (&local_200,&local_210,&local_228,&local_268,&local_318,&local_330,parsers_5,&local_380,
             &local_410,&local_458,&local_4a0);
  local_e0 = kj::Arena::copy<_b996553b_>(&this->arena,&local_200);
  kj::parse::sequence<_4a9f0e95_>
            ((Sequence_<_4a9f0e95_> *)&statementSequence,local_e0,
             (Sequence_<const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>,_false>,_kj::_::Tuple<>_>_>
              *)(anonymous_namespace)::commentsAndWhitespace);
  kj::parse::many<_954759d1_>(&local_538,(Sequence_<_4a9f0e95_> *)&statementSequence);
  kj::parse::sequence<_85621a7a_>
            (&local_520,
             (Sequence_<const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>,_false>,_kj::_::Tuple<>_>_>
              *)(anonymous_namespace)::commentsAndWhitespace,&local_538);
  other = kj::Arena::copy<_daac8182_>(&this->arena,&local_520);
  kj::parse::
  ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>
  ::operator=<_7ae3aee4_>(&(this->parsers).tokenSequence,other);
  subParsers_1_03 = &(this->parsers).statementSequence;
  statementEnd = (OneOf_<_100ac927_> *)subParsers_1_03;
  kj::parse::exactChar<(char)59>();
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,kj::_::Tuple<>>,kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,false>,kj::parse::_::ArrayToString>,kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::EndOfInput_const&>>const&>,true>>>const&>
            (&local_5f8,&local_5f9,(ExactlyConst_<char,____> *)(anonymous_namespace)::docComment,
             (Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>
              *)subParsers_1_03);
  local_608 = this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,kj::_::Tuple<>>,kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,false>,kj::parse::_::ArrayToString>,kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::EndOfInput_const&>>const&>,true>>>const&>,capnp::compiler::Lexer::Lexer(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__12>
            (&local_5e0,(parse *)&local_5f8,
             (Sequence_<kj::parse::ExactlyConst_<char,____>,_const_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>_&>
              *)&local_608,(Type *)subParsers_1_03);
  kj::parse::exactChar<(char)123>();
  pOVar2 = statementEnd;
  kj::parse::exactChar<(char)125>();
  kj::parse::
  sequence<kj::parse::ExactlyConst_<char,(char)123>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,kj::_::Tuple<>>,kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,false>,kj::parse::_::ArrayToString>,kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)1___:OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::EndOfInput_const&>>const&>,true>>>const&>
            (&local_670,(parse *)(local_673 + 2),
             (ExactlyConst_<char,____> *)(anonymous_namespace)::docComment,
             (Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>
              *)pOVar2,
             (ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Statement>_>_>
              *)local_673,(ExactlyConst_<char,____> *)(anonymous_namespace)::docComment,
             (Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>
              *)parsers_5);
  statement = (TransformWithLocation_<_bb8cc45_> *)this;
  kj::parse::
  transform<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)123>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,kj::_::Tuple<>>,kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,false>,kj::parse::_::ArrayToString>,kj::parse::OneOf_<kj::parse::Exac___>>const&>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__13>
            (&local_640,(parse *)&local_670,(Sequence_<_2f3d041a_> *)&statement,(Type *)pOVar2);
  kj::parse::
  oneOf<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,kj::_::Tuple<>>,kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,false>,kj::parse::_::ArrayToString>,kj::parse::OneOf___const&>,capnp::compiler::Lexer::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__13>>
            (&local_5c0,(parse *)&local_5e0,
             (Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_const_kj::parse::Optional_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Optional_<const_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___r_>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,___n_>_>,_kj::_::Tuple<>_>_>_>_&>,_kj::_::Tuple<>_>,_kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,____>_>,_kj::_::Tuple<>_>,_kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,_false>,_kj::parse::_::ArrayToString>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&>,_true>_>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_lexer_c__:260:11)>
              *)&local_640,(Transform_<_e61e25b1_> *)pOVar2);
  pOVar2 = kj::Arena::
           copy<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,kj::_::Tuple<>>,kj::parse::Transform_<kj::parse::Many_<kj::parse::CharGroup_,false>,kj::parse::_::ArrayToString>___onst&>,capnp::compiler::Lexer::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__13>>>
                     (&this->arena,&local_5c0);
  local_560 = pOVar2;
  kj::parse::
  sequence<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)32>>,___nst&>,capnp::compiler::Lexer::Transform_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__13>>&>
            ((Sequence_<_f1e3f6d_> *)((long)&local_6c1.first + 1),(parse *)commaDelimitedList,
             (ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>
              *)pOVar2,pOVar2);
  kj::parse::
  transformWithLocation<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Optional_<kj::par___:__13>>&>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__14>
            (&local_6a8,(parse *)((long)&local_6c1.first + 1),&local_6c1,(Type *)pOVar2);
  ppVar3 = (parse *)kj::Arena::
                    copy<kj::parse::TransformWithLocation_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::_____13>>&>,capnp::compiler::Lexer::Sequence_(capnp::Orphanage,capnp::compiler::ErrorReporter&)::__14>>
                              (&this->arena,&local_6a8);
  local_688 = ppVar3;
  kj::parse::
  sequence<kj::parse::TransformWithLocation_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::par___Tuple<>>,false>,kj::_::Tuple<>>const&>,false>,kj::_::Tuple<>>>const&>,false>,kj::_::Tuple<>>>const&>
            (&local_720,ppVar3,
             (TransformWithLocation_<_bb8cc45_> *)(anonymous_namespace)::commentsAndWhitespace,
             (Sequence_<const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>,_false>,_kj::_::Tuple<>_>_>
              *)ppVar3);
  kj::parse::
  many<kj::parse::Sequence_<kj::parse::TransformWithLocation_<kj::parse::Sequence_<kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Token>>>&,kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)59>,kj::parse::Optional_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)13>,kj::parse::ConstResult_<kj::parse::Optional_<kj::parse::ExactlyConst_<char,(char)10>>,kj::_::Tuple<>>>>const&>,kj::_::Tuple<>>,kj::parse::Many_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::Con___uple<>>,false>,kj::_::Tuple<>>const&>,false>,kj::_::Tuple<>>>const&>,false>,kj::_::Tuple<>>>const&>>
            ((Many_<_82eb539c_> *)local_708,(parse *)&local_720,subParser_01);
  kj::parse::
  sequence<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_17>,kj::parse::ExactlyConst_<char,(char)_69>,kj::parse::ExactlyConst_<char,(char)_65>>const&,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&>,false>,kj::_::Tuple<>>>const&,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>,kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::EndOfInput_const&>>const&,kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::___,false>,kj::_::Tuple<>>const&>,false>,kj::_::Tuple<>>>const&>,false>,kj::_::Tuple<>>>const_>_false>>
            ((Sequence_<_4053c1f6_> *)(local_708 + 0x18),
             (parse *)(anonymous_namespace)::commentsAndWhitespace,
             (Sequence_<const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>,_false>,_kj::_::Tuple<>_>_>
              *)local_708,(Many_<_82eb539c_> *)ppVar3);
  other_00 = kj::Arena::
             copy<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)_17>,kj::parse::ExactlyConst_<char,(char)_69>,kj::parse::ExactlyConst_<char,(char)_65>>const&,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>const&>,false>,kj::_::Tuple<>>>const&,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,(char)35>,kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>,false>,kj::_::Tuple<>>,kj::parse::OneOf_<kj::parse::ExactlyConst_<char,(char)10>,kj::parse::EndOfInput_const&>>const&,kj::parse::Sequence_<kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstRe___false>,kj::_::Tuple<>>const&>,false>,kj::_::Tuple<>>>const&>,false>,kj::_::Tuple<>>>const_>_false>>>
                       (&this->arena,(Sequence_<_4053c1f6_> *)(local_708 + 0x18));
  kj::parse::
  ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Statement>>>
  ::operator=((ParserRef<capnp::compiler::Lexer::ParserInput,kj::Array<capnp::Orphan<capnp::compiler::Statement>>>
               *)&(this->parsers).statementSequence,other_00);
  kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_capnp::Orphan<capnp::compiler::Token>_>
  ::operator=<_7934524b_>(&(this->parsers).token,local_e0);
  kj::parse::
  ParserRef<capnp::compiler::Lexer::ParserInput,capnp::Orphan<capnp::compiler::Statement>>::
  operator=((ParserRef<capnp::compiler::Lexer::ParserInput,capnp::Orphan<capnp::compiler::Statement>>
             *)&(this->parsers).statement,(TransformWithLocation_<_bb8cc45_> *)local_688);
  kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,kj::_::Tuple<>>::operator=
            ((ParserRef<capnp::compiler::Lexer::ParserInput,kj::_::Tuple<>> *)&this->parsers,
             (Sequence_<const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,____>,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>,_kj::parse::OneOf_<kj::parse::ExactlyConst_<char,___n_>,_const_kj::parse::EndOfInput__&>_>_&,_const_kj::parse::Sequence_<const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&,_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::Sequence_<const_kj::parse::Sequence_<kj::parse::ExactlyConst_<char,___xef_>,_kj::parse::ExactlyConst_<char,___xbb_>,_kj::parse::ExactlyConst_<char,___xbf_>_>_&,_const_kj::parse::ConstResult_<kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>,_kj::_::Tuple<>_>_&>,_false>,_kj::_::Tuple<>_>_>_&>,_false>,_kj::_::Tuple<>_>_>
              *)(anonymous_namespace)::commentsAndWhitespace);
  return;
}

Assistant:

Lexer::Lexer(Orphanage orphanageParam, ErrorReporter& errorReporter)
    : orphanage(orphanageParam) {

  // Note that because passing an lvalue to a parser constructor uses it by-referencee, it's safe
  // for us to use parsers.tokenSequence even though we haven't yet constructed it.
  auto& tokenSequence = parsers.tokenSequence;

  auto& commaDelimitedList = arena.copy(p::transform(
      p::sequence(tokenSequence, p::many(p::sequence(p::exactChar<','>(), tokenSequence))),
      [](kj::Array<Orphan<Token>>&& first, kj::Array<kj::Array<Orphan<Token>>>&& rest)
          -> kj::Array<kj::Array<Orphan<Token>>> {
        if (first == nullptr && rest == nullptr) {
          // Completely empty list.
          return nullptr;
        } else {
          uint restSize = rest.size();
          if (restSize > 0 && rest[restSize - 1] == nullptr) {
            // Allow for trailing commas by shortening the list by one item if the final token is
            // nullptr
            restSize--;
          }
          auto result = kj::heapArrayBuilder<kj::Array<Orphan<Token>>>(1 + restSize); // first+rest
          result.add(kj::mv(first));
          for (uint i = 0; i < restSize ; i++) {
            result.add(kj::mv(rest[i]));
          }
          return result.finish();
        }
      }));

  auto& token = arena.copy(p::oneOf(
      p::transformWithLocation(p::identifier,
          [this](Location loc, kj::String name) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setIdentifier(name);
            return t;
          }),
      p::transformWithLocation(p::doubleQuotedString,
          [this](Location loc, kj::String text) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setStringLiteral(text);
            return t;
          }),
      p::transformWithLocation(
          sequence(p::exactChar<'`'>(), p::many(p::anyOfChars("\r\n").invert())),
          [this](Location loc, kj::Array<char> text) -> Orphan<Token> {
            // Backtick-quoted line. Note that we assume either `\r` or `\n` is a valid line
            // ending (to cover all known line ending formats) but we replace the line ending
            // with `\n`. This way, changing the line endings of your source code doesn't affect
            // the compiled code.
            auto t = orphanage.newOrphan<Token>();
            // Append '\n' to the text.
            auto out = initTok(t, loc).initStringLiteral(text.size() + 1);
            memcpy(out.begin(), text.begin(), text.size());
            out[out.size() - 1] = '\n';
            return t;
          }),
      p::transformWithLocation(p::doubleQuotedHexBinary,
          [this](Location loc, kj::Array<byte> data) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setBinaryLiteral(data);
            return t;
          }),
      p::transformWithLocation(p::integer,
          [this](Location loc, uint64_t i) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setIntegerLiteral(i);
            return t;
          }),
      p::transformWithLocation(p::number,
          [this](Location loc, double x) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setFloatLiteral(x);
            return t;
          }),
      p::transformWithLocation(
          p::charsToString(p::oneOrMore(p::anyOfChars("!$%&*+-./:<=>?@^|~"))),
          [this](Location loc, kj::String text) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            initTok(t, loc).setOperator(text);
            return t;
          }),
      p::transformWithLocation(
          sequence(p::exactChar<'('>(), commaDelimitedList, p::exactChar<')'>()),
          [this](Location loc, kj::Array<kj::Array<Orphan<Token>>>&& items) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            buildTokenSequenceList(
                initTok(t, loc).initParenthesizedList(items.size()), kj::mv(items));
            return t;
          }),
      p::transformWithLocation(
          sequence(p::exactChar<'['>(), commaDelimitedList, p::exactChar<']'>()),
          [this](Location loc, kj::Array<kj::Array<Orphan<Token>>>&& items) -> Orphan<Token> {
            auto t = orphanage.newOrphan<Token>();
            buildTokenSequenceList(
                initTok(t, loc).initBracketedList(items.size()), kj::mv(items));
            return t;
          }),
      p::transformOrReject(p::transformWithLocation(
          p::oneOf(sequence(p::exactChar<'\xff'>(), p::exactChar<'\xfe'>()),
                   sequence(p::exactChar<'\xfe'>(), p::exactChar<'\xff'>()),
                   sequence(p::exactChar<'\x00'>())),
          [&errorReporter](Location loc) -> kj::Maybe<Orphan<Token>> {
            errorReporter.addError(loc.begin(), loc.end(),
                "Non-UTF-8 input detected. Cap'n Proto schema files must be UTF-8 text.");
            return kj::none;
          }), [](kj::Maybe<Orphan<Token>> param) { return param; })));
  parsers.tokenSequence = arena.copy(p::sequence(
      commentsAndWhitespace, p::many(p::sequence(token, commentsAndWhitespace))));

  auto& statementSequence = parsers.statementSequence;

  auto& statementEnd = arena.copy(p::oneOf(
      transform(p::sequence(p::exactChar<';'>(), docComment),
          [this](kj::Maybe<kj::Array<kj::String>>&& comment) -> Orphan<Statement> {
            auto result = orphanage.newOrphan<Statement>();
            auto builder = result.get();
            KJ_IF_SOME(c, comment) {
              attachDocComment(builder, kj::mv(c));
            }
            builder.setLine();
            return result;
          }),
      transform(
          p::sequence(p::exactChar<'{'>(), docComment, statementSequence, p::exactChar<'}'>(),
                      docComment),
          [this](kj::Maybe<kj::Array<kj::String>>&& comment,
                 kj::Array<Orphan<Statement>>&& statements,
                 kj::Maybe<kj::Array<kj::String>>&& lateComment)
              -> Orphan<Statement> {
            auto result = orphanage.newOrphan<Statement>();
            auto builder = result.get();
            KJ_IF_SOME(c, comment) {
              attachDocComment(builder, kj::mv(c));
            } else KJ_IF_SOME(c, lateComment) {
              attachDocComment(builder, kj::mv(c));
            }
            auto list = builder.initBlock(statements.size());
            for (uint i = 0; i < statements.size(); i++) {
              list.adoptWithCaveats(i, kj::mv(statements[i]));
            }
            return result;
          })
      ));

  auto& statement = arena.copy(p::transformWithLocation(p::sequence(tokenSequence, statementEnd),
      [](Location loc, kj::Array<Orphan<Token>>&& tokens, Orphan<Statement>&& statement) {
        auto builder = statement.get();
        auto tokensBuilder = builder.initTokens(tokens.size());
        for (uint i = 0; i < tokens.size(); i++) {
          tokensBuilder.adoptWithCaveats(i, kj::mv(tokens[i]));
        }
        builder.setStartByte(loc.begin());
        builder.setEndByte(loc.end());
        return kj::mv(statement);
      }));

  parsers.statementSequence = arena.copy(sequence(
      commentsAndWhitespace, many(sequence(statement, commentsAndWhitespace))));

  parsers.token = token;
  parsers.statement = statement;
  parsers.emptySpace = commentsAndWhitespace;
}